

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

string * Utility::binary_to_hex(string *__return_storage_ptr__,string *bin_input)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  string local_78;
  int local_54;
  undefined1 local_50 [4];
  int i;
  allocator local_1a;
  undefined1 local_19;
  string *local_18;
  string *bin_input_local;
  string *output;
  
  local_19 = 0;
  local_18 = bin_input;
  bin_input_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  while (uVar2 = std::__cxx11::string::length(), (uVar2 & 3) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,'0'
                   ,bin_input);
    std::__cxx11::string::operator=((string *)bin_input,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  for (local_54 = 0; uVar2 = (ulong)local_54, uVar3 = std::__cxx11::string::length(), uVar2 < uVar3;
      local_54 = local_54 + 4) {
    std::__cxx11::string::substr((ulong)&local_78,(ulong)bin_input);
    cVar1 = four_bits_to_hex(&local_78);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Utility::binary_to_hex(std::string bin_input) {
    std::string output = "";

    while (bin_input.length() % 4 != 0)bin_input = '0' + bin_input;
    for (int i = 0; i < bin_input.length(); i = i + 4) {
        output += four_bits_to_hex(bin_input.substr(i, 4));
    }
    return output;
}